

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

bool fm_processModelLine(char *fileName,int ln,string *text,FlightModel *fm)

{
  double dVar1;
  double dVar2;
  size_type sVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar9;
  char *szMsg;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double local_c0;
  string name;
  smatch m;
  string decimals;
  string_type local_50;
  
  uVar10 = (ulong)(uint)ln;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m,"LABEL_COLOR",(allocator<char> *)&name);
  bVar6 = begins_with<std::__cxx11::string>
                    (text,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m);
  std::__cxx11::string::~string((string *)&m);
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&m," ",(allocator<char> *)&decimals);
    str_tokenize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&name,text,(string *)&m,true);
    std::__cxx11::string::~string((string *)&m);
    bVar6 = name._M_string_length - (long)name._M_dataplus._M_p == 0x40;
    if (bVar6) {
      iVar7 = std::__cxx11::stoi((string *)(name._M_dataplus._M_p + 0x20),(size_t *)0x0,0x10);
      conv_color(iVar7,fm->LABEL_COLOR);
    }
    else if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
             ,0x31b,"fm_processModelLine",logWARN,"Format mismatch in \'%s\', line %d: %s",fileName,
             uVar10,(text->_M_dataplus)._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&name);
    return bVar6;
  }
  if ((fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)::
       re_abi_cxx11_ == '\0') &&
     (iVar7 = __cxa_guard_acquire(&fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)
                                   ::re_abi_cxx11_), iVar7 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)
                ::re_abi_cxx11_,"(\\w+)\\s+(-?\\d+)(\\.\\d+)?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)
                  ::re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)
                         ::re_abi_cxx11_);
  }
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m._M_begin._M_current = (char *)0x0;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
            (text,&m,&fm_processModelLine(char_const*,int,std::__cxx11::string&,LTAircraft::FlightModel&)
                      ::re_abi_cxx11_,0);
  if (m.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      m.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar8 = ((long)m.
                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    if (0xfffffffffffffffd < lVar8 - 8U) {
      psVar9 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                  ((long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)m.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) + -0x48);
      if (lVar8 - 5U < 0xfffffffffffffffe) {
        psVar9 = m.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str(&name,psVar9);
      lVar8 = (long)m.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)m.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((lVar8 == 0) || (0xfffffffffffffffc < lVar8 / 0x18 - 6U)) {
        psVar9 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)m.
                           super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x48);
      }
      else {
        psVar9 = m.
                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2;
      }
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str(&decimals,psVar9);
      local_c0 = atof(decimals._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&decimals);
      if ((long)m.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)m.
                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .
                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0xa8) {
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(&decimals,
              m.
              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .
              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 3);
        sVar3 = decimals._M_string_length;
        std::__cxx11::string::~string((string *)&decimals);
        if (1 < sVar3) {
          lVar8 = (long)m.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)m.
                        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar8 == 0) || (0xfffffffffffffffb < lVar8 / 0x18 - 7U)) {
            psVar9 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)m.
                               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               .
                               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x48);
          }
          else {
            psVar9 = m.
                     super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 3;
          }
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&local_50,psVar9);
          std::__cxx11::string::substr((ulong)&decimals,(ulong)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          dVar1 = pow(10.0,((double)CONCAT44(0x45300000,(int)(decimals._M_string_length >> 0x20)) -
                           1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)decimals._M_string_length) -
                           4503599627370496.0));
          dVar2 = atof(decimals._M_dataplus._M_p);
          local_c0 = local_c0 + dVar2 / dVar1;
          std::__cxx11::string::~string((string *)&decimals);
        }
      }
      if ((local_c0 < -10000.0) || (60000.0 < local_c0)) {
        if ((int)dataRefs.iLogLevel < 3) {
          szMsg = "Value invalid in \'%s\', line %d: %s";
          iVar7 = 0x33f;
LAB_001427d9:
          bVar6 = false;
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
                 ,iVar7,"fm_processModelLine",logWARN,szMsg,fileName,uVar10,(text->_M_dataplus)._M_p
                );
        }
        else {
LAB_00142cfd:
          bVar6 = false;
        }
      }
      else {
        bVar6 = std::operator==(&name,"GEAR_DURATION");
        uVar11 = SUB84(local_c0,0);
        uVar12 = (undefined4)((ulong)local_c0 >> 0x20);
        if (bVar6) {
          uVar4 = 0;
          uVar5 = 0x3ff00000;
          if (1.0 <= local_c0) {
            uVar4 = uVar11;
            uVar5 = uVar12;
          }
          uVar12 = uVar5;
          uVar11 = uVar4;
          lVar8 = 0x20;
        }
        else {
          bVar6 = std::operator==(&name,"GEAR_DEFLECTION");
          if (bVar6) {
            uVar4 = 0x9999999a;
            uVar5 = 0x3fb99999;
            if (0.1 <= local_c0) {
              uVar4 = uVar11;
              uVar5 = uVar12;
            }
            uVar12 = uVar5;
            uVar11 = uVar4;
            lVar8 = 0x28;
          }
          else {
            bVar6 = std::operator==(&name,"FLAPS_DURATION");
            if (bVar6) {
              uVar4 = 0;
              uVar5 = 0x3ff00000;
              if (1.0 <= local_c0) {
                uVar4 = uVar11;
                uVar5 = uVar12;
              }
              uVar12 = uVar5;
              uVar11 = uVar4;
              lVar8 = 0x30;
            }
            else {
              bVar6 = std::operator==(&name,"VSI_STABLE");
              if (bVar6) {
                lVar8 = 0x38;
              }
              else {
                bVar6 = std::operator==(&name,"ROTATE_TIME");
                if (bVar6) {
                  lVar8 = 0x40;
                }
                else {
                  bVar6 = std::operator==(&name,"VSI_FINAL");
                  if (bVar6) {
                    lVar8 = 0x48;
                  }
                  else {
                    bVar6 = std::operator==(&name,"VSI_INIT_CLIMB");
                    if (bVar6) {
                      lVar8 = 0x50;
                    }
                    else {
                      bVar6 = std::operator==(&name,"SPEED_INIT_CLIMB");
                      if (bVar6) {
                        lVar8 = 0x58;
                      }
                      else {
                        bVar6 = std::operator==(&name,"VSI_MAX");
                        if (bVar6) {
                          lVar8 = 0x60;
                        }
                        else {
                          bVar6 = std::operator==(&name,"AGL_GEAR_DOWN");
                          if (bVar6) {
                            lVar8 = 0x68;
                          }
                          else {
                            bVar6 = std::operator==(&name,"AGL_GEAR_UP");
                            if (bVar6) {
                              lVar8 = 0x70;
                            }
                            else {
                              bVar6 = std::operator==(&name,"AGL_FLARE");
                              if (bVar6) {
                                lVar8 = 0x78;
                              }
                              else {
                                bVar6 = std::operator==(&name,"MAX_TAXI_SPEED");
                                lVar8 = 0x80;
                                if (!bVar6) {
                                  bVar6 = std::operator==(&name,"MIN_REVERS_SPEED");
                                  lVar8 = 0x88;
                                  if (!bVar6) {
                                    bVar6 = std::operator==(&name,"TAXI_TURN_TIME");
                                    if (bVar6) {
                                      uVar4 = 0;
                                      uVar5 = 0x3ff00000;
                                      if (1.0 <= local_c0) {
                                        uVar4 = uVar11;
                                        uVar5 = uVar12;
                                      }
                                      uVar12 = uVar5;
                                      uVar11 = uVar4;
                                      lVar8 = 0x90;
                                    }
                                    else {
                                      bVar6 = std::operator==(&name,"FLIGHT_TURN_TIME");
                                      lVar8 = 0x98;
                                      if (!bVar6) {
                                        bVar6 = std::operator==(&name,"MIN_FLIGHT_TURN_TIME");
                                        if (bVar6) {
                                          uVar4 = 0;
                                          uVar5 = 0x3ff00000;
                                          if (1.0 <= local_c0) {
                                            uVar4 = uVar11;
                                            uVar5 = uVar12;
                                          }
                                          uVar12 = uVar5;
                                          uVar11 = uVar4;
                                          lVar8 = 0xa0;
                                        }
                                        else {
                                          bVar6 = std::operator==(&name,"ROLL_MAX_BANK");
                                          if (bVar6) {
                                            uVar4 = 0;
                                            uVar5 = 0x3ff00000;
                                            if (1.0 <= local_c0) {
                                              uVar4 = uVar11;
                                              uVar5 = uVar12;
                                            }
                                            uVar12 = uVar5;
                                            uVar11 = uVar4;
                                            lVar8 = 0xa8;
                                          }
                                          else {
                                            bVar6 = std::operator==(&name,"ROLL_RATE");
                                            if (bVar6) {
                                              uVar4 = 0;
                                              uVar5 = 0x3ff00000;
                                              if (1.0 <= local_c0) {
                                                uVar4 = uVar11;
                                                uVar5 = uVar12;
                                              }
                                              uVar12 = uVar5;
                                              uVar11 = uVar4;
                                              lVar8 = 0xb0;
                                            }
                                            else {
                                              bVar6 = std::operator==(&name,"MIN_FLIGHT_SPEED");
                                              lVar8 = 0xb8;
                                              if (!bVar6) {
                                                bVar6 = std::operator==(&name,"FLAPS_UP_SPEED");
                                                lVar8 = 0xc0;
                                                if (!bVar6) {
                                                  bVar6 = std::operator==(&name,"FLAPS_DOWN_SPEED");
                                                  lVar8 = 200;
                                                  if (!bVar6) {
                                                    bVar6 = std::operator==(&name,"MAX_FLIGHT_SPEED"
                                                                           );
                                                    lVar8 = 0xd0;
                                                    if (!bVar6) {
                                                      bVar6 = std::operator==(&name,"CRUISE_HEIGHT")
                                                      ;
                                                      lVar8 = 0xd8;
                                                      if (!bVar6) {
                                                        bVar6 = std::operator==(&name,
                                                  "ROLL_OUT_DECEL");
                                                  lVar8 = 0xe0;
                                                  if (!bVar6) {
                                                    bVar6 = std::operator==(&name,"PITCH_MIN");
                                                    lVar8 = 0xe8;
                                                    if (!bVar6) {
                                                      bVar6 = std::operator==(&name,"PITCH_MIN_VSI")
                                                      ;
                                                      lVar8 = 0xf0;
                                                      if (!bVar6) {
                                                        bVar6 = std::operator==(&name,"PITCH_MAX");
                                                        lVar8 = 0xf8;
                                                        if (!bVar6) {
                                                          bVar6 = std::operator==(&name,
                                                  "PITCH_MAX_VSI");
                                                  lVar8 = 0x100;
                                                  if (!bVar6) {
                                                    bVar6 = std::operator==(&name,"PITCH_FLAP_ADD");
                                                    lVar8 = 0x108;
                                                    if (!bVar6) {
                                                      bVar6 = std::operator==(&name,"PITCH_FLARE");
                                                      lVar8 = 0x110;
                                                      if (!bVar6) {
                                                        bVar6 = std::operator==(&name,"PITCH_RATE");
                                                        if (bVar6) {
                                                          uVar4 = 0;
                                                          uVar5 = 0x3ff00000;
                                                          if (1.0 <= local_c0) {
                                                            uVar4 = uVar11;
                                                            uVar5 = uVar12;
                                                          }
                                                          uVar12 = uVar5;
                                                          uVar11 = uVar4;
                                                          lVar8 = 0x118;
                                                        }
                                                        else {
                                                          bVar6 = std::operator==(&name,
                                                  "PROP_RPM_MAX");
                                                  lVar8 = 0x120;
                                                  if (!bVar6) {
                                                    bVar6 = std::operator==(&name,"LIGHT_LL_ALT");
                                                    lVar8 = 0x128;
                                                    if (!bVar6) {
                                                      bVar6 = std::operator==(&name,
                                                  "EXT_CAMERA_LON_OFS");
                                                  lVar8 = 0x140;
                                                  if (!bVar6) {
                                                    bVar6 = std::operator==(&name,
                                                  "EXT_CAMERA_LAT_OFS");
                                                  lVar8 = 0x148;
                                                  if (!bVar6) {
                                                    bVar6 = std::operator==(&name,
                                                  "EXT_CAMERA_VERT_OFS");
                                                  lVar8 = 0x150;
                                                  if (!bVar6) {
                                                    if (2 < (int)dataRefs.iLogLevel)
                                                    goto LAB_00142cfd;
                                                    szMsg = 
                                                  "Unknown parameter in \'%s\', line %d: %s";
                                                  iVar7 = 0x36d;
                                                  goto LAB_001427d9;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        *(ulong *)((long)&(fm->modelName)._M_dataplus._M_p + lVar8) = CONCAT44(uVar12,uVar11);
        bVar6 = true;
      }
      std::__cxx11::string::~string((string *)&name);
      goto LAB_00142d09;
    }
  }
  if ((int)dataRefs.iLogLevel < 3) {
    bVar6 = false;
    LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTAircraft.cpp"
           ,0x32a,"fm_processModelLine",logWARN,"Format mismatch in \'%s\', line %d: %s",fileName,
           uVar10,(text->_M_dataplus)._M_p);
  }
  else {
    bVar6 = false;
  }
LAB_00142d09:
  std::
  _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)&m);
  return bVar6;
}

Assistant:

bool fm_processModelLine (const char* fileName, int ln,
                          std::string& text, LTAircraft::FlightModel& fm)
{
    // There is one special case: LABEL_COLOR
    if (begins_with<std::string>(text, MDL_LABEL_COLOR))
    {
        // separate LABEL_COLOR from actual value
        const std::vector<std::string> t = str_tokenize(text, " ");
        if (t.size() != 2) {
            LOG_MSG(logWARN, ERR_CFG_FORMAT, fileName, ln, text.c_str());
            return false;
        }
        // convert the value first from hex to a number, then to a float array
        conv_color(std::stoi(t[1], nullptr, 16), fm.LABEL_COLOR);
        return true;
    }
    
    // split into name and value (keeping integer and digits separate to avoid different decimal interpretation later on)
    static std::regex re ("(\\w+)\\s+(-?\\d+)(\\.\\d+)?");
    std::smatch m;
    std::regex_search(text, m, re);
    
    // two or three matches expected
    if (m.size() < 3 || m.size() > 4) {
        LOG_MSG(logWARN, ERR_CFG_FORMAT, fileName, ln, text.c_str());
        return false;
    }
    
    // name and value
    std::string name (m[1]);
    double val = std::atof(m[2].str().c_str());
    
    // Are there some decimal places given?
    // (This handling makes us independend of atof() interpreting any localized decimal point.
    //  See https://github.com/TwinFan/LiveTraffic/issues/156 )
    if (m.size() == 4 && m[3].str().size() >= 2) {
        // copy everything after the dot
        std::string decimals = m[3].str().substr(1);
        const double divisor = std::pow(10, decimals.length());
        const double dec = std::atof(decimals.c_str()) / divisor;
        val += dec;
    }
    
    // some very very basic bounds checking
    if (val < -10000 || val > 60000) {
        LOG_MSG(logWARN, ERR_CFG_VAL_INVALID, fileName, ln, text.c_str());
        return false;
    }
                           
    // now find correct member variable and assign value
#define FM_ASSIGN(nameOfVal) if (name == #nameOfVal) fm.nameOfVal = val
#define FM_ASSIGN_MIN(nameOfVal,minVal) if (name == #nameOfVal) fm.nameOfVal = std::max(val,minVal)

    FM_ASSIGN_MIN(GEAR_DURATION,1.0);       // avoid zero - this is a moving parameter
    else FM_ASSIGN_MIN(GEAR_DEFLECTION,0.1);// avoid zero - this is a moving parameter
    else FM_ASSIGN_MIN(FLAPS_DURATION,1.0); // avoid zero - this is a moving parameter
    else FM_ASSIGN(VSI_STABLE);
    else FM_ASSIGN(ROTATE_TIME);
    else FM_ASSIGN(VSI_FINAL);
    else FM_ASSIGN(VSI_INIT_CLIMB);
    else FM_ASSIGN(SPEED_INIT_CLIMB);
    else FM_ASSIGN(VSI_MAX);
    else FM_ASSIGN(AGL_GEAR_DOWN);
    else FM_ASSIGN(AGL_GEAR_UP);
    else FM_ASSIGN(AGL_FLARE);
    else FM_ASSIGN(MAX_TAXI_SPEED);
    else FM_ASSIGN(MIN_REVERS_SPEED);
    else FM_ASSIGN_MIN(TAXI_TURN_TIME,1.0); // avoid zero - this becomes a divisor
    else FM_ASSIGN(FLIGHT_TURN_TIME);
    else FM_ASSIGN_MIN(MIN_FLIGHT_TURN_TIME,1.0); // avoid zero - this becomes a divisor
    else FM_ASSIGN_MIN(ROLL_MAX_BANK,1.0);  // avoid zero - this is a moving parameter
    else FM_ASSIGN_MIN(ROLL_RATE, 1.0);     // avoid zero - this becomes a divisor
    else FM_ASSIGN(MIN_FLIGHT_SPEED);
    else FM_ASSIGN(FLAPS_UP_SPEED);
    else FM_ASSIGN(FLAPS_DOWN_SPEED);
    else FM_ASSIGN(MAX_FLIGHT_SPEED);
    else FM_ASSIGN(CRUISE_HEIGHT);
    else FM_ASSIGN(ROLL_OUT_DECEL);
    else FM_ASSIGN(PITCH_MIN);
    else FM_ASSIGN(PITCH_MIN_VSI);
    else FM_ASSIGN(PITCH_MAX);
    else FM_ASSIGN(PITCH_MAX_VSI);
    else FM_ASSIGN(PITCH_FLAP_ADD);
    else FM_ASSIGN(PITCH_FLARE);
    else FM_ASSIGN_MIN(PITCH_RATE, 1.0);    // avoid zero - this becomes a divisor
    else FM_ASSIGN(PROP_RPM_MAX);
    else FM_ASSIGN(LIGHT_LL_ALT);
    else FM_ASSIGN(EXT_CAMERA_LON_OFS);
    else FM_ASSIGN(EXT_CAMERA_LAT_OFS);
    else FM_ASSIGN(EXT_CAMERA_VERT_OFS);
    else {
        LOG_MSG(logWARN, ERR_FM_UNKNOWN_NAME, fileName, ln, text.c_str());
        return false;
    }